

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

CallExpr __thiscall
mp::BasicExprFactory<std::allocator<char>_>::EndIterated<mp::CallExpr>
          (BasicExprFactory<std::allocator<char>_> *this,
          BasicIteratedExprBuilder<mp::CallExpr> builder)

{
  CallExpr CVar1;
  Impl *in_RSI;
  Impl *impl;
  
  CVar1 = internal::ExprBase::Create<mp::CallExpr>(in_RSI);
  return (BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>)
         CVar1.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_;
}

Assistant:

ExprType EndIterated(BasicIteratedExprBuilder<ExprType> builder) {
    typename ExprType::Impl *impl = builder.impl_;
    /// Check that all arguments provided.
    MP_ASSERT(builder.arg_index_ == impl->num_args, "too few arguments");
    return Expr::Create<ExprType>(impl);
  }